

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerGLSL::remove_unity_swizzle(CompilerGLSL *this,uint32_t base,string *op)

{
  uint uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  SPIRType *pSVar7;
  bool local_c9;
  SPIRType *type;
  uint32_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [36];
  undefined4 local_54;
  string local_50 [8];
  string final_swiz;
  size_type pos;
  string *op_local;
  uint32_t base_local;
  CompilerGLSL *this_local;
  
  uVar3 = ::std::__cxx11::string::find_last_of((char)op,0x2e);
  if ((uVar3 == 0xffffffffffffffff) || (uVar3 == 0)) {
    return false;
  }
  ::std::__cxx11::string::substr((ulong)local_50,(ulong)op);
  if (((this->backend).swizzle_is_function & 1U) != 0) {
    uVar4 = ::std::__cxx11::string::size();
    if (uVar4 < 2) {
      this_local._7_1_ = false;
      goto LAB_0030ce93;
    }
    ::std::__cxx11::string::size();
    ::std::__cxx11::string::substr((ulong)local_78,(ulong)local_50);
    bVar2 = ::std::operator==(local_78,"()");
    ::std::__cxx11::string::~string((string *)local_78);
    if (!bVar2) {
      this_local._7_1_ = false;
      goto LAB_0030ce93;
    }
    lVar5 = ::std::__cxx11::string::size();
    ::std::__cxx11::string::erase((ulong)local_50,lVar5 - 2);
  }
  for (type._0_4_ = 0; uVar4 = ::std::__cxx11::string::size(), (uint)type < uVar4;
      type._0_4_ = (uint)type + 1) {
    if ((3 < (uint)type) ||
       (pcVar6 = (char *)::std::__cxx11::string::operator[]((ulong)local_50),
       *pcVar6 != "xyzw"[(uint)type])) {
      this_local._7_1_ = false;
      goto LAB_0030ce93;
    }
  }
  pSVar7 = Compiler::expression_type(&this->super_Compiler,base);
  local_c9 = false;
  if (pSVar7->columns == 1) {
    local_c9 = VectorView<unsigned_int>::empty(&(pSVar7->array).super_VectorView<unsigned_int>);
  }
  if (local_c9 == false) {
    __assert_fail("type.columns == 1 && type.array.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                  ,0x239a,"bool spirv_cross::CompilerGLSL::remove_unity_swizzle(uint32_t, string &)"
                 );
  }
  uVar1 = pSVar7->vecsize;
  uVar4 = ::std::__cxx11::string::size();
  if (uVar1 == uVar4) {
    ::std::__cxx11::string::erase((ulong)op,uVar3);
  }
  this_local._7_1_ = true;
LAB_0030ce93:
  local_54 = 1;
  ::std::__cxx11::string::~string(local_50);
  return this_local._7_1_;
}

Assistant:

bool CompilerGLSL::remove_unity_swizzle(uint32_t base, string &op)
{
	auto pos = op.find_last_of('.');
	if (pos == string::npos || pos == 0)
		return false;

	string final_swiz = op.substr(pos + 1, string::npos);

	if (backend.swizzle_is_function)
	{
		if (final_swiz.size() < 2)
			return false;

		if (final_swiz.substr(final_swiz.size() - 2, string::npos) == "()")
			final_swiz.erase(final_swiz.size() - 2, string::npos);
		else
			return false;
	}

	// Check if final swizzle is of form .x, .xy, .xyz, .xyzw or similar.
	// If so, and previous swizzle is of same length,
	// we can drop the final swizzle altogether.
	for (uint32_t i = 0; i < final_swiz.size(); i++)
	{
		static const char expected[] = { 'x', 'y', 'z', 'w' };
		if (i >= 4 || final_swiz[i] != expected[i])
			return false;
	}

	auto &type = expression_type(base);

	// Sanity checking ...
	assert(type.columns == 1 && type.array.empty());

	if (type.vecsize == final_swiz.size())
		op.erase(pos, string::npos);
	return true;
}